

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void Serialize<SizeComputer,28u,unsigned_char>
               (SizeComputer *os,prevector<28U,_unsigned_char,_unsigned_int,_int> *v)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  long in_FS_OFFSET;
  Span<const_std::byte> SVar4;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = v->_size;
  uVar3 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar3 = uVar1;
  }
  WriteCompactSize(os,(ulong)uVar3);
  uVar1 = v->_size;
  uVar3 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar3 = uVar1;
  }
  if (uVar3 != 0) {
    SVar4 = MakeByteSpan<prevector<28u,unsigned_char,unsigned_int,int>const&>(v);
    os->nSize = os->nSize + SVar4.m_size;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream& os, const prevector<N, T>& v)
{
    if constexpr (BasicByte<T>) { // Use optimized version for unformatted basic bytes
        WriteCompactSize(os, v.size());
        if (!v.empty()) os.write(MakeByteSpan(v));
    } else {
        Serialize(os, Using<VectorFormatter<DefaultFormatter>>(v));
    }
}